

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# private_impl.cpp
# Opt level: O0

void __thiscall raspicam::_private::Private_Impl::setFormat(Private_Impl *this,RASPICAM_FORMAT fmt)

{
  bool bVar1;
  ostream *poVar2;
  RASPICAM_FORMAT in_ESI;
  Private_Impl *in_RDI;
  
  bVar1 = isOpened(in_RDI);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cerr,
                             "/workspace/llm4binary/github/license_c_cmakelists/rmsalinas[P]raspicam/src/private/private_impl.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x21c);
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = std::operator<<(poVar2,"setFormat");
    poVar2 = std::operator<<(poVar2,": can not change format with camera already opened");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  else {
    (in_RDI->State).captureFtm = in_ESI;
  }
  return;
}

Assistant:

void Private_Impl::setFormat ( RASPICAM_FORMAT fmt ) {
            if ( isOpened() ) {
                cerr<<__FILE__<<":"<<__LINE__<<":"<<__func__<<": can not change format with camera already opened"<<endl;
                return;
            }
            State.captureFtm = fmt;
        }